

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

void EndTextureMode(void)

{
  float16 result;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  rlDrawRenderBatchActive();
  (*glad_glBindFramebuffer)(0x8d40,0);
  SetupViewport(CORE.Window.render.width,CORE.Window.render.height);
  RLGL.State.currentMatrix = &RLGL.State.modelview;
  RLGL.State.currentMatrixMode = 0x1700;
  rlLoadIdentity();
  local_40 = CORE.Window.screenScale.m0;
  local_3c = CORE.Window.screenScale.m1;
  local_38 = CORE.Window.screenScale.m2;
  local_34 = CORE.Window.screenScale.m3;
  local_30 = CORE.Window.screenScale.m4;
  local_2c = CORE.Window.screenScale.m5;
  local_28 = CORE.Window.screenScale.m6;
  local_24 = CORE.Window.screenScale.m7;
  local_20 = CORE.Window.screenScale.m8;
  local_1c = CORE.Window.screenScale.m9;
  local_18 = CORE.Window.screenScale.m10;
  local_14 = CORE.Window.screenScale.m11;
  local_10 = CORE.Window.screenScale.m12;
  local_c = CORE.Window.screenScale.m13;
  local_8 = CORE.Window.screenScale.m14;
  local_4 = CORE.Window.screenScale.m15;
  rlMultMatrixf(&local_40);
  CORE.Window.currentFbo.height = CORE.Window.render.height;
  CORE.Window.currentFbo.width = CORE.Window.render.width;
  CORE.Window.usingFbo = false;
  return;
}

Assistant:

void EndTextureMode(void)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

    rlDisableFramebuffer();         // Disable render target (fbo)

    // Set viewport to default framebuffer size
    SetupViewport(CORE.Window.render.width, CORE.Window.render.height);

    // Go back to the modelview state from BeginDrawing since we are back to the default FBO
    rlMatrixMode(RL_MODELVIEW);     // Switch back to modelview matrix
    rlLoadIdentity();               // Reset current matrix (modelview)
    rlMultMatrixf(MatrixToFloat(CORE.Window.screenScale)); // Apply screen scaling if required

    // Reset current fbo to screen size
    CORE.Window.currentFbo.width = CORE.Window.render.width;
    CORE.Window.currentFbo.height = CORE.Window.render.height;
    CORE.Window.usingFbo = false;
}